

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  polyprediction *a_s;
  v_array<char> *pvVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  pointer ppeVar6;
  example *ec;
  int *piVar7;
  _func_void_int_string_v_array<char> *p_Var8;
  double dVar9;
  v_array<char> vVar10;
  bool bVar11;
  char cVar12;
  ostream *poVar13;
  int iVar14;
  float *pfVar15;
  pointer ppeVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  multi_ex *__range2;
  string outputString;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffdc8 [11];
  char in_stack_fffffffffffffdd3;
  float in_stack_fffffffffffffdd4;
  ulong local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar4 = (head_ec->l).cs.costs._begin;
  pwVar5 = (head_ec->l).cs.costs._end;
  if ((((head_ec->tag)._end != (head_ec->tag)._begin) ||
      ((head_ec->super_example_predict).indices._end !=
       (head_ec->super_example_predict).indices._begin)) &&
     (bVar11 = ec_is_label_definition(head_ec), !bVar11)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + head_ec->num_features;
    ppVar2 = &head_ec->l;
    a_s = &head_ec->pred;
    cVar12 = (*(code *)PTR_test_label_002cfa50)();
    if (cVar12 == '\0') {
      ppeVar16 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar16 == ppeVar6) {
        dVar9 = 0.0;
      }
      else {
        in_stack_fffffffffffffdd4 = 0.0;
        local_218 = 0;
        do {
          ec = *ppeVar16;
          bVar11 = COST_SENSITIVE::ec_is_example_header(ec);
          iVar14 = 3;
          if ((!bVar11) && (iVar14 = 2, *hit_loss == false)) {
            if (local_218 == ((a_s->a_s)._begin)->action) {
              in_stack_fffffffffffffdd4 = ((ec->l).cs.costs._begin)->x;
              *hit_loss = true;
            }
            local_218 = local_218 + 1;
            iVar14 = 0;
          }
        } while (((iVar14 == 3) || (iVar14 == 0)) && (ppeVar16 = ppeVar16 + 1, ppeVar16 != ppeVar6))
        ;
        dVar9 = (double)in_stack_fffffffffffffdd4;
      }
      all->sd->sum_loss = all->sd->sum_loss + dVar9;
      all->sd->sum_loss_since_last_dump = dVar9 + all->sd->sum_loss_since_last_dump;
    }
    pvVar3 = &head_ec->tag;
    piVar7 = (all->final_prediction_sink)._end;
    for (piVar17 = (all->final_prediction_sink)._begin; piVar17 != piVar7; piVar17 = piVar17 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar17,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar3);
    }
    if (0 < all->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar19 = (long)pwVar5 - (long)pwVar4;
      if (lVar19 != 0) {
        lVar19 = lVar19 >> 4;
        pfVar15 = &pwVar4->partial_prediction;
        lVar18 = 0;
        do {
          if (lVar18 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdd3,1);
          }
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdd3 = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,&stack0xfffffffffffffdd3,1);
          std::ostream::_M_insert<double>((double)*pfVar15);
          lVar18 = lVar18 + 1;
          pfVar15 = pfVar15 + 4;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar18);
      }
      p_Var8 = all->print_text;
      iVar14 = all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar10._end._3_1_ = in_stack_fffffffffffffdd3;
      vVar10._0_11_ = in_stack_fffffffffffffdc8;
      vVar10._end._4_4_ = in_stack_fffffffffffffdd4;
      vVar10.end_array = (char *)all;
      vVar10.erase_count = (size_t)head_ec;
      (*p_Var8)(iVar14,(string)*pvVar3,vVar10);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar11 = (bool)(*(code *)PTR_test_label_002cfa50)(ppVar2);
    COST_SENSITIVE::print_update(all,bVar11,head_ec,ec_seq,true,0);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (ec_is_example_header(*ex))
        continue;
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}